

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# views_pool.cpp
# Opt level: O0

void __thiscall cppcms::views::generator::~generator(generator *this)

{
  noncopyable *in_RDI;
  
  booster::hold_ptr<cppcms::views::generator::data>::~hold_ptr
            ((hold_ptr<cppcms::views::generator::data> *)in_RDI);
  std::__cxx11::string::~string((string *)(in_RDI + 0x30));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cppcms::base_view,_std::default_delete<cppcms::base_view>_>_(*)(std::basic_ostream<char,_std::char_traits<char>_>_&,_cppcms::base_content_*),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cppcms::base_view,_std::default_delete<cppcms::base_view>_>_(*)(std::basic_ostream<char,_std::char_traits<char>_>_&,_cppcms::base_content_*)>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cppcms::base_view,_std::default_delete<cppcms::base_view>_>_(*)(std::basic_ostream<char,_std::char_traits<char>_>_&,_cppcms::base_content_*),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cppcms::base_view,_std::default_delete<cppcms::base_view>_>_(*)(std::basic_ostream<char,_std::char_traits<char>_>_&,_cppcms::base_content_*)>_>_>
          *)0x3cf964);
  booster::noncopyable::~noncopyable(in_RDI);
  return;
}

Assistant:

generator::~generator()
{
}